

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int file_type(char *name)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint uVar4;
  stat statbuf;
  stat sStack_a8;
  
  iVar1 = stat(name,&sStack_a8);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    __stream = _stderr;
    uVar4 = 0;
    if (*piVar2 != 2) {
      pcVar3 = strerror(*piVar2);
      fprintf(__stream,"%s: stat: %s\n",name,pcVar3);
      uVar4 = 0;
    }
  }
  else {
    uVar4 = 1;
    if ((sStack_a8.st_mode & 0xf000) != 0x8000) {
      uVar4 = (sStack_a8.st_mode & 0xf000) == 0x4000 ^ 3;
    }
  }
  return uVar4;
}

Assistant:

int file_type(const char *name)
{
    struct stat statbuf;

    if (stat(name, &statbuf) < 0) {
        if (errno != ENOENT)
            fprintf(stderr, "%s: stat: %s\n", name, strerror(errno));
        return FILE_TYPE_NONEXISTENT;
    }

    if (S_ISREG(statbuf.st_mode))
        return FILE_TYPE_FILE;

    if (S_ISDIR(statbuf.st_mode))
        return FILE_TYPE_DIRECTORY;

    return FILE_TYPE_WEIRD;
}